

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O3

void pzshape::TPZShapeLinear::ShapeOrder
               (TPZVec<long> *id,TPZVec<int> *order,TPZGenMatrix<int> *shapeorders)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  ulong i;
  
  iVar2 = *order->fStore;
  uVar1 = iVar2 + 1;
  if (shapeorders->fRows != (long)(int)uVar1) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapelinear.cpp"
               ,0x123);
  }
  piVar3 = TPZGenMatrix<int>::operator()(shapeorders,0,0);
  *piVar3 = 1;
  piVar3 = TPZGenMatrix<int>::operator()(shapeorders,1,0);
  *piVar3 = 1;
  if (1 < iVar2) {
    i = 2;
    do {
      piVar3 = TPZGenMatrix<int>::operator()(shapeorders,i,0);
      *piVar3 = (int)i;
      i = i + 1;
    } while (uVar1 != i);
  }
  return;
}

Assistant:

void TPZShapeLinear::ShapeOrder(const TPZVec<int64_t> &id, const TPZVec<int> &order, TPZGenMatrix<int> &shapeorders)//, TPZVec<int64_t> &sides
    {
        int nshape = 2+(order[0]-1);
        if (shapeorders.Rows() != nshape) {
            DebugStop();
        }
        shapeorders(0,0) = 1;
        shapeorders(1,0) = 1;
        for (int i=2; i<nshape; i++) {
            shapeorders(i,0) = i;
        }
    }